

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QString>>
                 (QDebug *debug,char *which,QList<QString> *c)

{
  bool bVar1;
  const_iterator o;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  QList<QString> *in_stack_ffffffffffffff90;
  Stream *this;
  char *in_stack_ffffffffffffffd8;
  const_iterator t;
  const_iterator local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,in_stack_ffffffffffffffd8);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  local_18.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QString>::begin(in_stack_ffffffffffffff90);
  o = QList<QString>::end(in_stack_ffffffffffffff90);
  t = o;
  bVar1 = QList<QString>::const_iterator::operator!=(&local_18,o);
  if (bVar1) {
    QList<QString>::const_iterator::operator*(&local_18);
    QDebug::operator<<((QDebug *)this,(QString *)in_RDI);
    QList<QString>::const_iterator::operator++(&local_18);
  }
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_18,o), bVar1) {
    in_stack_ffffffffffffff90 = (QList<QString> *)QDebug::operator<<(in_RSI,(char *)t.i);
    QList<QString>::const_iterator::operator*(&local_18);
    QDebug::operator<<((QDebug *)this,(QString *)in_RDI);
    QList<QString>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff90,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}